

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_persist.cpp
# Opt level: O2

bool node::LoadMempool(CTxMemPool *pool,path *load_path,Chainstate *active_chainstate,
                      ImportMempoolOptions *opts)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  uint64_t uVar6;
  element_type *peVar7;
  bool bVar8;
  time_point tVar9;
  uint64_t uVar10;
  Logger *pLVar11;
  uint64_t accept_time;
  undefined8 uVar12;
  _Rb_tree_node_base *p_Var13;
  ulong uVar14;
  char *args_2;
  long in_FS_OFFSET;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view source_file_02;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  char *in_stack_fffffffffffffd60;
  unsigned_long *in_stack_fffffffffffffd68;
  unsigned_long local_260;
  int percentage_done;
  uint64_t txns_tried;
  uint64_t total_txns_to_load;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_240;
  vector<std::byte,_std::allocator<std::byte>_> xor_key;
  int64_t unbroadcast;
  int64_t already_there;
  int64_t failed;
  int64_t expired;
  int64_t count;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_1e8;
  AutoFile local_1d0;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> unbroadcast_txids;
  string log_msg;
  CAmount amountdelta;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  CTransactionRef tx;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if ((load_path->super_path)._M_pathname._M_string_length == 0) {
    bVar8 = false;
  }
  else {
    local_1d0.m_file =
         std::function<_IO_FILE_*(const_fs::path_&,_const_char_*)>::operator()
                   (&opts->mockable_fopen_function,load_path,"rb");
    local_1d0.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d0.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d0.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_1e8);
    if (local_1d0.m_file == (_IO_FILE *)0x0) {
      pLVar11 = LogInstance();
      bVar8 = BCLog::Logger::Enabled(pLVar11);
      if (bVar8) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_allocated_capacity =
             log_msg.field_2._M_allocated_capacity & 0xffffffffffffff00;
        tinyformat::format<>
                  ((string *)&unbroadcast_txids,"Failed to open mempool file. Continuing anyway.\n")
        ;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &unbroadcast_txids);
        std::__cxx11::string::~string((string *)&unbroadcast_txids);
        pLVar11 = LogInstance();
        unbroadcast_txids._M_t._M_impl._0_1_ = 0x61;
        unbroadcast_txids._M_t._M_impl._1_7_ = 0;
        unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0xccb1ff;
        unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/mempool_persist.cpp"
        ;
        source_file_00._M_len = 0x61;
        str_00._M_str = log_msg._M_dataplus._M_p;
        str_00._M_len = log_msg._M_string_length;
        logging_function_01._M_str = "LoadMempool";
        logging_function_01._M_len = 0xb;
        BCLog::Logger::LogPrintStr(pLVar11,str_00,logging_function_01,source_file_00,0x2f,ALL,Info);
        std::__cxx11::string::~string((string *)&log_msg);
      }
    }
    else {
      count = 0;
      expired = 0;
      failed = 0;
      already_there = 0;
      unbroadcast = 0;
      tVar9 = NodeClock::now();
      uVar10 = ser_readdata64<AutoFile>(&local_1d0);
      xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (uVar10 == 1) {
LAB_007aa76c:
        std::vector<std::byte,_std::allocator<std::byte>_>::vector
                  ((vector<std::byte,_std::allocator<std::byte>_> *)&local_240,&xor_key);
        std::vector<std::byte,_std::allocator<std::byte>_>::operator=
                  (&local_1d0.m_xor,(vector<std::byte,_std::allocator<std::byte>_> *)&local_240);
        std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_240);
        total_txns_to_load = ser_readdata64<AutoFile>(&local_1d0);
        txns_tried = 0;
        args_2 = "Loading %u mempool transactions from file...\n";
        source_file_02._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/mempool_persist.cpp"
        ;
        source_file_02._M_len = 0x61;
        logging_function._M_str = "LoadMempool";
        logging_function._M_len = 0xb;
        LogPrintf_<unsigned_long>
                  (logging_function,source_file_02,0x49,
                   IPC|I2P|QT|COINDB|PROXY|RAND|CMPCTBLOCK|ADDRMAN|RPC|BENCH|TOR,
                   (Level)&total_txns_to_load,in_stack_fffffffffffffd60,in_stack_fffffffffffffd68);
        uVar14 = 0;
LAB_007aa808:
        uVar6 = total_txns_to_load;
        uVar10 = txns_tried;
        if (txns_tried <= total_txns_to_load && total_txns_to_load - txns_tried != 0)
        goto code_r0x007aa81e;
        log_msg._M_string_length = log_msg._M_string_length & 0xffffffff00000000;
        log_msg.field_2._M_allocated_capacity = 0;
        log_msg.field_2._8_8_ = &log_msg._M_string_length;
        Unserialize<AutoFile,uint256,long,std::less<uint256>,std::allocator<std::pair<uint256_const,long>>>
                  (&local_1d0,
                   (map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
                    *)&log_msg);
        uVar12 = log_msg.field_2._8_8_;
        if (opts->apply_fee_delta_priority == true) {
          for (; (size_type *)uVar12 != &log_msg._M_string_length;
              uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12)) {
            CTxMemPool::PrioritiseTransaction
                      (pool,(uint256 *)(uVar12 + 0x20),(CAmount *)(uVar12 + 0x40));
          }
        }
        p_Var1 = &unbroadcast_txids._M_t._M_impl.super__Rb_tree_header;
        unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ = 0;
        unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._1_7_ = 0;
        unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ =
             SUB81(p_Var1,0);
        unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_left._1_7_ =
             (undefined7)((ulong)p_Var1 >> 8);
        unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_1_ =
             unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_1_;
        unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_right._1_7_ =
             unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_left._1_7_;
        Unserialize<AutoFile,uint256,std::less<uint256>,std::allocator<uint256>>
                  (&local_1d0,&unbroadcast_txids);
        if (opts->apply_unbroadcast_set == true) {
          unbroadcast = unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_node_count;
          for (p_Var13 = (_Rb_tree_node_base *)
                         CONCAT71(unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header.
                                  _M_left._1_7_,
                                  unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header.
                                  _M_left._0_1_); (_Rb_tree_header *)p_Var13 != p_Var1;
              p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
            CTxMemPool::get((CTxMemPool *)&tx,(uint256 *)pool);
            peVar7 = tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            if (peVar7 != (element_type *)0x0) {
              CTxMemPool::AddUnbroadcastTx(pool,(uint256 *)(p_Var13 + 1));
            }
          }
        }
        std::
        _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
        ::~_Rb_tree(&unbroadcast_txids._M_t);
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_long>,_std::_Select1st<std::pair<const_uint256,_long>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
        ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_long>,_std::_Select1st<std::pair<const_uint256,_long>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
                     *)&log_msg);
LAB_007aae16:
        std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
                  (&xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
        if (uVar10 < uVar6) goto LAB_007aaf44;
        pLVar11 = LogInstance();
        bVar8 = BCLog::Logger::Enabled(pLVar11);
        if (bVar8) {
          log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
          log_msg._M_string_length = 0;
          log_msg.field_2._M_allocated_capacity =
               log_msg.field_2._M_allocated_capacity & 0xffffffffffffff00;
          tinyformat::format<long,long,long,long,long>
                    ((string *)&unbroadcast_txids,
                     (tinyformat *)
                     "Imported mempool transactions from file: %i succeeded, %i failed, %i expired, %i already there, %i waiting for initial broadcast\n"
                     ,(char *)&count,&failed,&expired,&already_there,&unbroadcast,
                     (long *)in_stack_fffffffffffffd60);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&log_msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &unbroadcast_txids);
          std::__cxx11::string::~string((string *)&unbroadcast_txids);
          pLVar11 = LogInstance();
          unbroadcast_txids._M_t._M_impl._0_1_ = 0x61;
          unbroadcast_txids._M_t._M_impl._1_7_ = 0;
          unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0xccb1ff;
          unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          source_file_01._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/mempool_persist.cpp"
          ;
          source_file_01._M_len = 0x61;
          str_01._M_str = log_msg._M_dataplus._M_p;
          str_01._M_len = log_msg._M_string_length;
          logging_function_02._M_str = "LoadMempool";
          logging_function_02._M_len = 0xb;
          BCLog::Logger::LogPrintStr
                    (pLVar11,str_01,logging_function_02,source_file_01,0x91,ALL,Info);
          std::__cxx11::string::~string((string *)&log_msg);
        }
        bVar8 = true;
        goto LAB_007aaf46;
      }
      if (uVar10 == 2) {
        Unserialize<AutoFile,std::byte,std::allocator<std::byte>>(&local_1d0,&xor_key);
        goto LAB_007aa76c;
      }
      std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
                (&xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
    }
LAB_007aaf44:
    bVar8 = false;
LAB_007aaf46:
    AutoFile::~AutoFile(&local_1d0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar8;
code_r0x007aa81e:
  auVar15._8_4_ = (int)(txns_tried >> 0x20);
  auVar15._0_8_ = txns_tried;
  auVar15._12_4_ = 0x45300000;
  auVar16._8_4_ = (int)(total_txns_to_load >> 0x20);
  auVar16._0_8_ = total_txns_to_load;
  auVar16._12_4_ = 0x45300000;
  percentage_done =
       (int)((((auVar15._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)txns_tried) - 4503599627370496.0)) * 100.0) /
            ((auVar16._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)total_txns_to_load) - 4503599627370496.0)));
  if ((int)uVar14 < percentage_done / 10) {
    local_260 = total_txns_to_load - txns_tried;
    pLVar11 = LogInstance();
    bVar8 = BCLog::Logger::Enabled(pLVar11);
    if (bVar8) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_allocated_capacity =
           log_msg.field_2._M_allocated_capacity & 0xffffffffffffff00;
      tinyformat::format<int,unsigned_long,unsigned_long>
                ((string *)&unbroadcast_txids,
                 (tinyformat *)
                 "Progress loading mempool transactions from file: %d%% (tried %u, %u remaining)\n",
                 (char *)&percentage_done,(int *)&txns_tried,&local_260,(unsigned_long *)args_2);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &unbroadcast_txids);
      std::__cxx11::string::~string((string *)&unbroadcast_txids);
      pLVar11 = LogInstance();
      unbroadcast_txids._M_t._M_impl._0_1_ = 0x61;
      unbroadcast_txids._M_t._M_impl._1_7_ = 0;
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0xccb1ff;
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      in_stack_fffffffffffffd60 =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/mempool_persist.cpp"
      ;
      args_2 = (char *)0x4f;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/mempool_persist.cpp"
      ;
      source_file._M_len = 0x61;
      str._M_str = log_msg._M_dataplus._M_p;
      str._M_len = log_msg._M_string_length;
      logging_function_00._M_str = "LoadMempool";
      logging_function_00._M_len = 0xb;
      BCLog::Logger::LogPrintStr(pLVar11,str,logging_function_00,source_file,0x4f,ALL,Info);
      std::__cxx11::string::~string((string *)&log_msg);
    }
    uVar14 = (long)percentage_done / 10 & 0xffffffff;
  }
  txns_tried = txns_tried + 1;
  tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  log_msg._M_dataplus._M_p = "\x01";
  log_msg._M_string_length = (size_type)&tx;
  ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_>::Unserialize<AutoFile>
            ((ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_> *)&log_msg,
             &local_1d0);
  accept_time = ser_readdata64<AutoFile>(&local_1d0);
  amountdelta = ser_readdata64<AutoFile>(&local_1d0);
  if (opts->use_current_time != false) {
    accept_time = (long)tVar9.__d.__r / 1000000000;
  }
  if ((amountdelta != 0) && (opts->apply_fee_delta_priority == true)) {
    CTxMemPool::PrioritiseTransaction
              (pool,&((tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->hash).m_wrapped,&amountdelta);
  }
  if (((pool->m_opts).expiry.__r * -1000000000 + (long)tVar9.__d.__r) / 1000000000 <
      (long)accept_time) {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock7,&cs_main,"cs_main",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/mempool_persist.cpp"
               ,100,false);
    args_2 = (char *)0x0;
    AcceptToMemoryPool((MempoolAcceptResult *)&log_msg,active_chainstate,&tx,accept_time,false,false
                      );
    if ((int)log_msg._M_dataplus._M_p == 0) {
      count = count + 1;
    }
    else {
      unbroadcast_txids._M_t._M_impl._0_1_ = 0;
      uVar12 = *(undefined8 *)
                ((tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      uVar3 = *(undefined8 *)
               (((tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      uVar4 = *(undefined8 *)
               (((tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      uVar5 = *(undefined8 *)
               (((tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._1_7_ =
           (undefined7)uVar4;
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ =
           (undefined1)((ulong)uVar4 >> 0x38);
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_left._1_7_ =
           (undefined7)uVar5;
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_1_ =
           (undefined1)((ulong)uVar5 >> 0x38);
      unbroadcast_txids._M_t._M_impl._1_7_ = SUB87(uVar12,0);
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ =
           (undefined1)((ulong)uVar12 >> 0x38);
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_color._1_3_ =
           (undefined3)uVar3;
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
           SUB84((ulong)uVar3 >> 0x18,0);
      unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ =
           (undefined1)((ulong)uVar3 >> 0x38);
      bVar8 = CTxMemPool::exists(pool,(GenTxid *)&unbroadcast_txids);
      if (bVar8) {
        already_there = already_there + 1;
      }
      else {
        failed = failed + 1;
      }
    }
    MempoolAcceptResult::~MempoolAcceptResult((MempoolAcceptResult *)&log_msg);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock7.super_unique_lock);
  }
  else {
    expired = expired + 1;
  }
  bVar8 = util::SignalInterrupt::operator_cast_to_bool(active_chainstate->m_chainman->m_interrupt);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (bVar8) goto LAB_007aae16;
  goto LAB_007aa808;
}

Assistant:

bool LoadMempool(CTxMemPool& pool, const fs::path& load_path, Chainstate& active_chainstate, ImportMempoolOptions&& opts)
{
    if (load_path.empty()) return false;

    AutoFile file{opts.mockable_fopen_function(load_path, "rb")};
    if (file.IsNull()) {
        LogInfo("Failed to open mempool file. Continuing anyway.\n");
        return false;
    }

    int64_t count = 0;
    int64_t expired = 0;
    int64_t failed = 0;
    int64_t already_there = 0;
    int64_t unbroadcast = 0;
    const auto now{NodeClock::now()};

    try {
        uint64_t version;
        file >> version;
        std::vector<std::byte> xor_key;
        if (version == MEMPOOL_DUMP_VERSION_NO_XOR_KEY) {
            // Leave XOR-key empty
        } else if (version == MEMPOOL_DUMP_VERSION) {
            file >> xor_key;
        } else {
            return false;
        }
        file.SetXor(xor_key);
        uint64_t total_txns_to_load;
        file >> total_txns_to_load;
        uint64_t txns_tried = 0;
        LogInfo("Loading %u mempool transactions from file...\n", total_txns_to_load);
        int next_tenth_to_report = 0;
        while (txns_tried < total_txns_to_load) {
            const int percentage_done(100.0 * txns_tried / total_txns_to_load);
            if (next_tenth_to_report < percentage_done / 10) {
                LogInfo("Progress loading mempool transactions from file: %d%% (tried %u, %u remaining)\n",
                        percentage_done, txns_tried, total_txns_to_load - txns_tried);
                next_tenth_to_report = percentage_done / 10;
            }
            ++txns_tried;

            CTransactionRef tx;
            int64_t nTime;
            int64_t nFeeDelta;
            file >> TX_WITH_WITNESS(tx);
            file >> nTime;
            file >> nFeeDelta;

            if (opts.use_current_time) {
                nTime = TicksSinceEpoch<std::chrono::seconds>(now);
            }

            CAmount amountdelta = nFeeDelta;
            if (amountdelta && opts.apply_fee_delta_priority) {
                pool.PrioritiseTransaction(tx->GetHash(), amountdelta);
            }
            if (nTime > TicksSinceEpoch<std::chrono::seconds>(now - pool.m_opts.expiry)) {
                LOCK(cs_main);
                const auto& accepted = AcceptToMemoryPool(active_chainstate, tx, nTime, /*bypass_limits=*/false, /*test_accept=*/false);
                if (accepted.m_result_type == MempoolAcceptResult::ResultType::VALID) {
                    ++count;
                } else {
                    // mempool may contain the transaction already, e.g. from
                    // wallet(s) having loaded it while we were processing
                    // mempool transactions; consider these as valid, instead of
                    // failed, but mark them as 'already there'
                    if (pool.exists(GenTxid::Txid(tx->GetHash()))) {
                        ++already_there;
                    } else {
                        ++failed;
                    }
                }
            } else {
                ++expired;
            }
            if (active_chainstate.m_chainman.m_interrupt)
                return false;
        }
        std::map<uint256, CAmount> mapDeltas;
        file >> mapDeltas;

        if (opts.apply_fee_delta_priority) {
            for (const auto& i : mapDeltas) {
                pool.PrioritiseTransaction(i.first, i.second);
            }
        }

        std::set<uint256> unbroadcast_txids;
        file >> unbroadcast_txids;
        if (opts.apply_unbroadcast_set) {
            unbroadcast = unbroadcast_txids.size();
            for (const auto& txid : unbroadcast_txids) {
                // Ensure transactions were accepted to mempool then add to
                // unbroadcast set.
                if (pool.get(txid) != nullptr) pool.AddUnbroadcastTx(txid);
            }
        }
    } catch (const std::exception& e) {
        LogInfo("Failed to deserialize mempool data on file: %s. Continuing anyway.\n", e.what());
        return false;
    }

    LogInfo("Imported mempool transactions from file: %i succeeded, %i failed, %i expired, %i already there, %i waiting for initial broadcast\n", count, failed, expired, already_there, unbroadcast);
    return true;
}